

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::buildArrayAccess_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int uniform,int idx)

{
  byte bVar1;
  ostream *poVar2;
  string local_248 [32];
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [48];
  string local_1b8 [32];
  undefined1 local_198 [8];
  StringStream s;
  int idx_local;
  int uniform_local;
  LayoutBindingBaseCase *this_local;
  
  s.super_ostringstream._368_4_ = idx;
  s.super_ostringstream._372_4_ = uniform;
  StringStream::StringStream((StringStream *)local_198);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (local_1b8,this,(ulong)(uint)s.super_ostringstream._372_4_);
  poVar2 = std::operator<<((ostream *)local_198,local_1b8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
            (local_1e8,this,(ulong)(uint)s.super_ostringstream._368_4_);
  std::operator<<(poVar2,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1b8);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_228,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (local_208,this,local_228);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_228);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)local_198,".");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
              (local_248,this,(ulong)(uint)s.super_ostringstream._372_4_);
    std::operator<<(poVar2,local_248);
    std::__cxx11::string::~string(local_248);
  }
  std::__cxx11::ostringstream::str();
  StringStream::~StringStream((StringStream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildArrayAccess(int uniform, int idx)
	{
		StringStream s;
		s << getDefaultUniformName(uniform) << buildArray(idx);
		if (!buildBlockName(getDefaultUniformName()).empty())
		{
			s << "." << getDefaultUniformName(uniform);
		}
		return s.str();
	}